

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddTweak
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,string *file,
          TweakMethod tweak)

{
  ostream *poVar1;
  Indent IVar2;
  long *plVar3;
  string tws;
  ostringstream tw;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  plVar3 = (long *)((long)&(this->super_cmInstallGenerator).super_cmScriptGenerator.
                           _vptr_cmScriptGenerator + tws.field_2._M_allocated_capacity);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((tws._M_string_length & 1) != 0) {
    tws._M_string_length = *(undefined8 *)(*plVar3 + -1 + tws._M_string_length);
  }
  (*(code *)tws._M_string_length)(plVar3,local_1a8,indent.Level + 2,config,file);
  std::__cxx11::stringbuf::str();
  if (local_1c0 != 0) {
    IVar2.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar2.Level = IVar2.Level + -1;
      } while (IVar2.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" AND\n",6);
    IVar2.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        IVar2.Level = IVar2.Level + -1;
      } while (IVar2.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"   NOT IS_SYMLINK \"",0x13);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1c8,local_1c0);
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void cmInstallTargetGenerator::AddTweak(std::ostream& os, Indent indent,
                                        const std::string& config,
                                        std::string const& file,
                                        TweakMethod tweak)
{
  std::ostringstream tw;
  (this->*tweak)(tw, indent.Next(), config, file);
  std::string tws = tw.str();
  if (!tws.empty()) {
    os << indent << "if(EXISTS \"" << file << "\" AND\n"
       << indent << "   NOT IS_SYMLINK \"" << file << "\")\n";
    os << tws;
    os << indent << "endif()\n";
  }
}